

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_usdf.cpp
# Opt level: O1

bool __thiscall USDFParser::Parse(USDFParser *this,int lumpnum,FileReader *lump,int lumplen)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  char *buffer;
  char *name;
  int iVar4;
  
  buffer = (char *)operator_new__((long)lumplen);
  (*(lump->super_FileReaderBase)._vptr_FileReaderBase[2])(lump,buffer,(long)lumplen);
  name = FWadCollection::GetLumpFullName(&Wads,lumpnum);
  FScanner::OpenMem((FScanner *)this,name,buffer,lumplen);
  operator_delete__(buffer);
  iVar4 = 1;
  FScanner::SetCMode((FScanner *)this,true);
  bVar1 = FScanner::CheckString((FScanner *)this,"namespace");
  if (bVar1) {
    FScanner::MustGetToken((FScanner *)this,0x3d);
    FScanner::MustGetToken((FScanner *)this,0x102);
    iVar3 = FName::NameManager::FindName
                      (&FName::NameData,(this->super_UDMFParserBase).sc.String,false);
    (this->super_UDMFParserBase).namespc.Index = iVar3;
    if (iVar3 != 0x18c) {
      if (iVar3 != 0xb) {
        FScanner::ScriptMessage
                  ((FScanner *)this,"Unknown namespace %s. Ignoring dialogue lump.\n",
                   (this->super_UDMFParserBase).sc.String);
        return false;
      }
      iVar4 = 2;
    }
    (this->super_UDMFParserBase).namespace_bits = iVar4;
    FScanner::MustGetToken((FScanner *)this,0x3b);
    bVar2 = FScanner::GetString((FScanner *)this);
    bVar1 = true;
    if (bVar2) {
      do {
        bVar2 = FScanner::Compare((FScanner *)this,"conversation");
        if (bVar2) {
          FScanner::MustGetToken((FScanner *)this,0x7b);
          bVar2 = ParseConversation(this);
          if (!bVar2) {
            return false;
          }
        }
        else {
          bVar2 = FScanner::Compare((FScanner *)this,"include");
          if (bVar2) {
            FScanner::MustGetToken((FScanner *)this,0x3d);
            FScanner::MustGetToken((FScanner *)this,0x102);
            LoadScriptFile((this->super_UDMFParserBase).sc.String,true,0);
            FScanner::MustGetToken((FScanner *)this,0x3b);
          }
          else {
            UDMFParserBase::Skip(&this->super_UDMFParserBase);
          }
        }
        bVar2 = FScanner::GetString((FScanner *)this);
      } while (bVar2);
    }
  }
  else {
    bVar1 = false;
    FScanner::ScriptMessage((FScanner *)this,"Map does not define a namespace.\n");
  }
  return bVar1;
}

Assistant:

bool Parse(int lumpnum, FileReader *lump, int lumplen)
	{
		char *buffer = new char[lumplen];
		lump->Read(buffer, lumplen);
		sc.OpenMem(Wads.GetLumpFullName(lumpnum), buffer, lumplen);
		delete [] buffer;
		sc.SetCMode(true);
		// Namespace must be the first field because everything else depends on it.
		if (sc.CheckString("namespace"))
		{
			sc.MustGetToken('=');
			sc.MustGetToken(TK_StringConst);
			namespc = sc.String;
			switch(namespc)
			{
			case NAME_ZDoom:
				namespace_bits = Zd;
				break;
			case NAME_Strife:
				namespace_bits = St;
				break;
			default:
				sc.ScriptMessage("Unknown namespace %s. Ignoring dialogue lump.\n", sc.String);
				return false;
			}
			sc.MustGetToken(';');
		}
		else
		{
			sc.ScriptMessage("Map does not define a namespace.\n");
			return false;
		}

		while (sc.GetString())
		{
			if (sc.Compare("conversation"))
			{
				sc.MustGetToken('{');
				if (!ParseConversation()) return false;
			}
			else if (sc.Compare("include"))
			{
				sc.MustGetToken('=');
				sc.MustGetToken(TK_StringConst);
				LoadScriptFile(sc.String, true);
				sc.MustGetToken(';');
			}
			else
			{
				Skip();
			}
		}
		return true;
	}